

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  long lVar2;
  RayQueryContext *k;
  int iVar3;
  int iVar4;
  int iVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  vbool<4> vVar11;
  size_t sVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  undefined4 uVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  uint uVar19;
  ulong uVar20;
  RayQueryContext *pRVar21;
  size_t sVar22;
  NodeRef root;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar23;
  NodeRef *pNVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  float fVar44;
  float fVar45;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  float fVar49;
  float fVar50;
  undefined1 auVar47 [16];
  float fVar51;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar48;
  undefined1 auVar52 [16];
  float fVar53;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar54 [16];
  float fVar58;
  float fVar61;
  float fVar62;
  float fVar64;
  undefined1 auVar59 [16];
  uint uVar63;
  uint uVar65;
  undefined1 auVar60 [16];
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  float fVar70;
  float fVar73;
  float fVar74;
  undefined1 auVar71 [16];
  float fVar75;
  undefined1 auVar72 [16];
  vfloat4 a0;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar81;
  float fVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar83;
  float fVar87;
  float fVar88;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar93;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar10 = mm_lookupmask_ps._8_8_;
  uVar9 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar22 = (bvh->root).ptr;
  if (sVar22 != 8) {
    auVar52 = *(undefined1 (*) [16])(ray + 0x80);
    auVar47._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar52._0_4_);
    auVar47._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar52._4_4_);
    auVar47._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar52._8_4_);
    auVar47._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar52._12_4_);
    uVar19 = movmskps((int)context,auVar47);
    if (uVar19 != 0) {
      uVar20 = (ulong)(uVar19 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar58 = tray.dir.field_0._0_4_;
      fVar61 = tray.dir.field_0._4_4_;
      fVar62 = tray.dir.field_0._8_4_;
      fVar64 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar46 = tray.dir.field_0._16_4_;
      fVar49 = tray.dir.field_0._20_4_;
      fVar50 = tray.dir.field_0._24_4_;
      fVar51 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar53 = tray.dir.field_0._32_4_;
      fVar55 = tray.dir.field_0._36_4_;
      fVar56 = tray.dir.field_0._40_4_;
      fVar57 = tray.dir.field_0._44_4_;
      auVar71._0_4_ = fVar46 * fVar46 + fVar53 * fVar53;
      auVar71._4_4_ = fVar49 * fVar49 + fVar55 * fVar55;
      auVar71._8_4_ = fVar50 * fVar50 + fVar56 * fVar56;
      auVar71._12_4_ = fVar51 * fVar51 + fVar57 * fVar57;
      auVar76._0_4_ = fVar58 * fVar58 + auVar71._0_4_;
      auVar76._4_4_ = fVar61 * fVar61 + auVar71._4_4_;
      auVar76._8_4_ = fVar62 * fVar62 + auVar71._8_4_;
      auVar76._12_4_ = fVar64 * fVar64 + auVar71._12_4_;
      auVar71 = rsqrtps(auVar71,auVar76);
      fVar70 = auVar71._0_4_;
      fVar26 = auVar71._4_4_;
      fVar27 = auVar71._8_4_;
      fVar44 = auVar71._12_4_;
      pre.depth_scale.field_0.v[0] = fVar70 * fVar70 * auVar76._0_4_ * -0.5 * fVar70 + fVar70 * 1.5;
      pre.depth_scale.field_0.v[1] = fVar26 * fVar26 * auVar76._4_4_ * -0.5 * fVar26 + fVar26 * 1.5;
      pre.depth_scale.field_0.v[2] = fVar27 * fVar27 * auVar76._8_4_ * -0.5 * fVar27 + fVar27 * 1.5;
      pre.depth_scale.field_0.v[3] = fVar44 * fVar44 * auVar76._12_4_ * -0.5 * fVar44 + fVar44 * 1.5
      ;
      while (uVar20 != 0) {
        lVar2 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        auVar76 = insertps(ZEXT416(*(uint *)(ray + lVar2 * 4 + 0x40)),
                           *(undefined4 *)(ray + lVar2 * 4 + 0x50),0x1c);
        auVar76 = insertps(auVar76,*(undefined4 *)(ray + lVar2 * 4 + 0x60),0x28);
        fVar70 = *(float *)((long)pre.ray_space + lVar2 * 4 + -0x10);
        auVar77._0_4_ = auVar76._0_4_ * fVar70;
        auVar77._4_4_ = auVar76._4_4_ * fVar70;
        auVar77._8_4_ = auVar76._8_4_ * fVar70;
        auVar77._12_4_ = auVar76._12_4_ * fVar70;
        uVar8 = CONCAT44(auVar77._4_4_,auVar77._4_4_);
        auVar28._0_8_ = uVar8 ^ 0x8000000080000000;
        auVar28._8_4_ = -auVar77._12_4_;
        auVar28._12_4_ = -auVar77._12_4_;
        auVar76 = blendps(auVar28,ZEXT816(0),0xe);
        auVar91._4_4_ = auVar76._0_4_;
        auVar91._0_4_ = auVar77._8_4_;
        auVar91._8_4_ = auVar76._4_4_;
        auVar91._12_4_ = 0;
        auVar90._4_4_ = auVar76._0_4_;
        auVar90._0_4_ = auVar77._8_4_;
        auVar90._8_4_ = auVar76._4_4_;
        auVar90._12_4_ = 0;
        auVar90 = dpps(auVar90 << 0x20,auVar91 << 0x20,0x7f);
        uVar8 = CONCAT44(auVar77._12_4_,auVar77._8_4_);
        auVar79._0_8_ = uVar8 ^ 0x8000000080000000;
        auVar79._8_4_ = -auVar77._8_4_;
        auVar79._12_4_ = -auVar77._12_4_;
        auVar71 = insertps(auVar79,auVar77,0x2a);
        auVar76 = dpps(auVar71,auVar71,0x7f);
        iVar25 = -(uint)(auVar76._0_4_ < auVar90._0_4_);
        auVar29._4_4_ = iVar25;
        auVar29._0_4_ = iVar25;
        auVar29._8_4_ = iVar25;
        auVar29._12_4_ = iVar25;
        auVar76 = blendvps(auVar71,auVar91 << 0x20,auVar29);
        auVar71 = dpps(auVar76,auVar76,0x7f);
        auVar91 = rsqrtss(auVar71,auVar71);
        fVar26 = auVar91._0_4_;
        fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * auVar71._0_4_ * 0.5 * fVar26;
        fVar27 = fVar26 * auVar76._0_4_;
        fVar44 = fVar26 * auVar76._4_4_;
        fVar45 = fVar26 * auVar76._8_4_;
        fVar26 = fVar26 * auVar76._12_4_;
        fVar78 = fVar44 * auVar77._0_4_ - auVar77._4_4_ * fVar27;
        fVar81 = fVar45 * auVar77._4_4_ - auVar77._8_4_ * fVar44;
        fVar82 = fVar27 * auVar77._8_4_ - auVar77._0_4_ * fVar45;
        auVar80._12_4_ = fVar26 * auVar77._12_4_ - auVar77._12_4_ * fVar26;
        auVar80._0_8_ = CONCAT44(fVar82,fVar81);
        auVar80._8_4_ = fVar78;
        auVar84._8_4_ = fVar78;
        auVar84._0_8_ = auVar80._0_8_;
        auVar84._12_4_ = auVar80._12_4_;
        auVar76 = dpps(auVar84,auVar80,0x7f);
        valid_i = (vint<4> *)(uVar20 - 1);
        uVar20 = uVar20 & (ulong)valid_i;
        auVar71 = rsqrtss(auVar76,auVar76);
        fVar26 = auVar71._0_4_;
        fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * auVar76._0_4_ * 0.5 * fVar26;
        aVar30.m128[1] = fVar26 * fVar78;
        aVar30.m128[0] = fVar45;
        aVar30.m128[2] = auVar77._8_4_ * fVar70;
        aVar30.m128[3] = 0.0;
        pre.ray_space[lVar2].vx.field_0.m128[0] = fVar27;
        pre.ray_space[lVar2].vx.field_0.m128[1] = fVar26 * fVar81;
        pre.ray_space[lVar2].vx.field_0.m128[2] = auVar77._0_4_ * fVar70;
        pre.ray_space[lVar2].vx.field_0.m128[3] = 0.0;
        aVar6.m128[1] = fVar26 * fVar82;
        aVar6.m128[0] = fVar44;
        aVar6.m128[2] = auVar77._4_4_ * fVar70;
        aVar6.m128[3] = 0.0;
        pre.ray_space[lVar2].vy.field_0 = aVar6;
        pre.ray_space[lVar2].vz.field_0 = aVar30;
      }
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      fVar70 = (float)DAT_01f4bd50;
      fVar26 = DAT_01f4bd50._4_4_;
      fVar27 = DAT_01f4bd50._8_4_;
      fVar44 = DAT_01f4bd50._12_4_;
      auVar31._4_4_ = -(uint)(ABS(fVar61) < fVar26);
      auVar31._0_4_ = -(uint)(ABS(fVar58) < fVar70);
      auVar31._8_4_ = -(uint)(ABS(fVar62) < fVar27);
      auVar31._12_4_ = -(uint)(ABS(fVar64) < fVar44);
      auVar90 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f4bd50,auVar31)
      ;
      auVar32._4_4_ = -(uint)(ABS(fVar49) < fVar26);
      auVar32._0_4_ = -(uint)(ABS(fVar46) < fVar70);
      auVar32._8_4_ = -(uint)(ABS(fVar50) < fVar27);
      auVar32._12_4_ = -(uint)(ABS(fVar51) < fVar44);
      auVar71 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f4bd50,auVar32)
      ;
      auVar33._4_4_ = -(uint)(ABS(fVar55) < fVar26);
      auVar33._0_4_ = -(uint)(ABS(fVar53) < fVar70);
      auVar33._8_4_ = -(uint)(ABS(fVar56) < fVar27);
      auVar33._12_4_ = -(uint)(ABS(fVar57) < fVar44);
      auVar91 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f4bd50,auVar33)
      ;
      auVar76 = rcpps(auVar33,auVar90);
      fVar46 = auVar76._0_4_;
      auVar59._0_4_ = auVar90._0_4_ * fVar46;
      fVar49 = auVar76._4_4_;
      auVar59._4_4_ = auVar90._4_4_ * fVar49;
      fVar50 = auVar76._8_4_;
      auVar59._8_4_ = auVar90._8_4_ * fVar50;
      fVar51 = auVar76._12_4_;
      auVar59._12_4_ = auVar90._12_4_ * fVar51;
      tray.rdir.field_0._0_4_ = (1.0 - auVar59._0_4_) * fVar46 + fVar46;
      tray.rdir.field_0._4_4_ = (1.0 - auVar59._4_4_) * fVar49 + fVar49;
      tray.rdir.field_0._8_4_ = (1.0 - auVar59._8_4_) * fVar50 + fVar50;
      tray.rdir.field_0._12_4_ = (1.0 - auVar59._12_4_) * fVar51 + fVar51;
      auVar76 = rcpps(auVar59,auVar71);
      fVar46 = auVar76._0_4_;
      fVar49 = auVar76._4_4_;
      fVar50 = auVar76._8_4_;
      fVar51 = auVar76._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar71._0_4_ * fVar46) * fVar46 + fVar46;
      tray.rdir.field_0._20_4_ = (1.0 - auVar71._4_4_ * fVar49) * fVar49 + fVar49;
      tray.rdir.field_0._24_4_ = (1.0 - auVar71._8_4_ * fVar50) * fVar50 + fVar50;
      tray.rdir.field_0._28_4_ = (1.0 - auVar71._12_4_ * fVar51) * fVar51 + fVar51;
      auVar76 = rcpps(auVar76,auVar91);
      fVar46 = auVar76._0_4_;
      fVar49 = auVar76._4_4_;
      fVar50 = auVar76._8_4_;
      fVar51 = auVar76._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar91._0_4_ * fVar46) * fVar46 + fVar46;
      tray.rdir.field_0._36_4_ = (1.0 - auVar91._4_4_ * fVar49) * fVar49 + fVar49;
      tray.rdir.field_0._40_4_ = (1.0 - auVar91._8_4_ * fVar50) * fVar50 + fVar50;
      tray.rdir.field_0._44_4_ = (1.0 - auVar91._12_4_ * fVar51) * fVar51 + fVar51;
      auVar54._0_12_ = ZEXT812(0);
      auVar54._12_4_ = 0;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar34._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar34._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar34._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar34._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar34);
      auVar35._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar35._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar35._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar35._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar35);
      auVar76 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar54);
      auVar52 = maxps(auVar52,auVar54);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar76,auVar47);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar52,auVar47);
      auVar52._8_4_ = 0xffffffff;
      auVar52._0_8_ = 0xffffffffffffffff;
      auVar52._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar52 ^ auVar47);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar19 = 3;
        pRVar21 = (RayQueryContext *)0x0;
      }
      else {
        pRVar21 = (RayQueryContext *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar19 = ((char)pRVar21 == '\0') + 2;
      }
      pNVar24 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar23 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_node[1].ptr = sVar22;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar14 = 0x2223f80;
      aVar93 = _DAT_01f45a30;
LAB_006d1da8:
      do {
        do {
          root.ptr = pNVar24[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006d237d;
          pNVar24 = pNVar24 + -1;
          paVar23 = paVar23 + -1;
          aVar94.v = *(__m128 *)paVar23->v;
          auVar36._4_4_ = -(uint)(aVar94._4_4_ < tray.tfar.field_0.v[1]);
          auVar36._0_4_ = -(uint)(aVar94._0_4_ < tray.tfar.field_0.v[0]);
          auVar36._8_4_ = -(uint)(aVar94._8_4_ < tray.tfar.field_0.v[2]);
          auVar36._12_4_ = -(uint)(aVar94._12_4_ < tray.tfar.field_0.v[3]);
          uVar14 = movmskps(uVar14,auVar36);
        } while (uVar14 == 0);
        uVar20 = (ulong)(byte)uVar14;
        uVar15 = POPCOUNT(uVar14 & 0xff);
        uVar14 = uVar15;
        if (uVar19 < uVar15) {
LAB_006d1de9:
          vVar11.field_0 = terminated.field_0;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006d237d;
              auVar42._4_4_ = -(uint)(aVar94.v[1] < tray.tfar.field_0.v[1]);
              auVar42._0_4_ = -(uint)(aVar94.v[0] < tray.tfar.field_0.v[0]);
              auVar42._8_4_ = -(uint)(aVar94.v[2] < tray.tfar.field_0.v[2]);
              auVar42._12_4_ = -(uint)(aVar94.v[3] < tray.tfar.field_0.v[3]);
              uVar14 = movmskps(uVar14,auVar42);
              if (uVar14 != 0) {
                pRVar21 = (RayQueryContext *)This->leafIntersector;
                valid_o.field_0._0_8_ = uVar9;
                valid_o.field_0._8_8_ = uVar10;
                uVar14 = movmskps(uVar19,(undefined1  [16])terminated.field_0);
                uVar20 = (ulong)(uVar14 ^ 0xf);
                puVar17 = (undefined8 *)
                          ((long)pRVar21 +
                          (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x18);
                puVar18 = puVar17;
                while (uVar20 != 0) {
                  lVar2 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                    }
                  }
                  uVar20 = uVar20 & uVar20 - 1;
                  valid_i = (vint<4> *)&pre;
                  pRVar21 = context;
                  puVar18 = (undefined8 *)
                            (*(code *)*puVar17)(valid_i,ray,lVar2,context,
                                                (byte *)(root.ptr & 0xfffffffffffffff0));
                  aVar93 = _DAT_01f45a30;
                  if ((char)puVar18 != '\0') {
                    valid_o.field_0.i[lVar2] = -1;
                  }
                }
                auVar7._8_8_ = valid_o.field_0._8_8_;
                auVar7._0_8_ = valid_o.field_0._0_8_;
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])vVar11.field_0 | auVar7);
                uVar14 = movmskps((int)puVar18,(undefined1  [16])terminated.field_0);
                if (uVar14 == 0xf) goto LAB_006d237d;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_006d1da8;
            }
            uVar20 = root.ptr & 0xfffffffffffffff0;
            sVar22 = 8;
            aVar94 = aVar93;
            for (pRVar21 = (RayQueryContext *)&DAT_0000001c;
                (pRVar21 != (RayQueryContext *)&DAT_00000020 &&
                (sVar1 = *(size_t *)((uVar20 - 0xe0) + (long)pRVar21 * 8), sVar1 != 8));
                pRVar21 = (RayQueryContext *)((long)&pRVar21->scene + 1)) {
              if ((root.ptr & 7) == 0) {
                fVar46 = *(float *)((root.ptr - 0x50) + (long)pRVar21 * 4);
                fVar55 = *(float *)((root.ptr - 0x40) + (long)pRVar21 * 4);
                fVar49 = *(float *)((root.ptr - 0x30) + (long)pRVar21 * 4);
                fVar58 = *(float *)((root.ptr - 0x20) + (long)pRVar21 * 4);
                fVar45 = (fVar46 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                fVar78 = (fVar46 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                fVar81 = (fVar46 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                fVar61 = (fVar46 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
                ;
                fVar46 = (fVar49 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
                ;
                fVar51 = (fVar49 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
                ;
                fVar56 = (fVar49 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
                ;
                fVar49 = (fVar49 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
                ;
                fVar50 = *(float *)((root.ptr - 0x10) + (long)pRVar21 * 4);
                fVar53 = (fVar50 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_
                ;
                fVar57 = (fVar50 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_
                ;
                fVar62 = (fVar50 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_
                ;
                fVar50 = (fVar50 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_
                ;
                fVar70 = (fVar55 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                fVar26 = (fVar55 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                fVar27 = (fVar55 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                fVar44 = (fVar55 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
                ;
                fVar82 = (fVar58 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
                ;
                fVar73 = (fVar58 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
                ;
                fVar74 = (fVar58 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
                ;
                fVar75 = (fVar58 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
                ;
                fVar55 = *(float *)(root.ptr + (long)pRVar21 * 4);
                auVar85._0_4_ =
                     (fVar55 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
                auVar85._4_4_ =
                     (fVar55 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
                auVar85._8_4_ =
                     (fVar55 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
                auVar85._12_4_ =
                     (fVar55 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              }
              else {
                fVar46 = *(float *)((uVar20 - 0x50) + (long)pRVar21 * 4);
                fVar49 = *(float *)((uVar20 - 0x40) + (long)pRVar21 * 4);
                fVar50 = *(float *)((uVar20 - 0x30) + (long)pRVar21 * 4);
                fVar51 = *(float *)((uVar20 - 0x20) + (long)pRVar21 * 4);
                fVar53 = *(float *)((uVar20 - 0x10) + (long)pRVar21 * 4);
                fVar55 = *(float *)(uVar20 + (long)pRVar21 * 4);
                fVar56 = *(float *)(uVar20 + 0x10 + (long)pRVar21 * 4);
                fVar57 = *(float *)(uVar20 + 0x20 + (long)pRVar21 * 4);
                fVar58 = *(float *)(uVar20 + 0x30 + (long)pRVar21 * 4);
                auVar72._0_4_ =
                     (float)tray.dir.field_0._16_4_ * fVar55 +
                     (float)tray.dir.field_0._32_4_ * fVar58;
                auVar72._4_4_ =
                     (float)tray.dir.field_0._20_4_ * fVar55 +
                     (float)tray.dir.field_0._36_4_ * fVar58;
                auVar72._8_4_ =
                     (float)tray.dir.field_0._24_4_ * fVar55 +
                     (float)tray.dir.field_0._40_4_ * fVar58;
                auVar72._12_4_ =
                     (float)tray.dir.field_0._28_4_ * fVar55 +
                     (float)tray.dir.field_0._44_4_ * fVar58;
                auVar95._0_4_ =
                     fVar46 * (float)tray.dir.field_0._0_4_ +
                     fVar51 * (float)tray.dir.field_0._16_4_ +
                     fVar56 * (float)tray.dir.field_0._32_4_;
                auVar95._4_4_ =
                     fVar46 * (float)tray.dir.field_0._4_4_ +
                     fVar51 * (float)tray.dir.field_0._20_4_ +
                     fVar56 * (float)tray.dir.field_0._36_4_;
                auVar95._8_4_ =
                     fVar46 * (float)tray.dir.field_0._8_4_ +
                     fVar51 * (float)tray.dir.field_0._24_4_ +
                     fVar56 * (float)tray.dir.field_0._40_4_;
                auVar95._12_4_ =
                     fVar46 * (float)tray.dir.field_0._12_4_ +
                     fVar51 * (float)tray.dir.field_0._28_4_ +
                     fVar56 * (float)tray.dir.field_0._44_4_;
                auVar86._0_4_ =
                     fVar49 * (float)tray.dir.field_0._0_4_ +
                     fVar53 * (float)tray.dir.field_0._16_4_ +
                     fVar57 * (float)tray.dir.field_0._32_4_;
                auVar86._4_4_ =
                     fVar49 * (float)tray.dir.field_0._4_4_ +
                     fVar53 * (float)tray.dir.field_0._20_4_ +
                     fVar57 * (float)tray.dir.field_0._36_4_;
                auVar86._8_4_ =
                     fVar49 * (float)tray.dir.field_0._8_4_ +
                     fVar53 * (float)tray.dir.field_0._24_4_ +
                     fVar57 * (float)tray.dir.field_0._40_4_;
                auVar86._12_4_ =
                     fVar49 * (float)tray.dir.field_0._12_4_ +
                     fVar53 * (float)tray.dir.field_0._28_4_ +
                     fVar57 * (float)tray.dir.field_0._44_4_;
                fVar61 = (float)DAT_01f4bd50;
                fVar62 = DAT_01f4bd50._4_4_;
                fVar64 = DAT_01f4bd50._8_4_;
                fVar70 = DAT_01f4bd50._12_4_;
                auVar38._4_4_ = -(uint)(ABS(auVar95._4_4_) < fVar62);
                auVar38._0_4_ = -(uint)(ABS(auVar95._0_4_) < fVar61);
                auVar38._8_4_ = -(uint)(ABS(auVar95._8_4_) < fVar64);
                auVar38._12_4_ = -(uint)(ABS(auVar95._12_4_) < fVar70);
                auVar91 = blendvps(auVar95,_DAT_01f4bd50,auVar38);
                auVar39._4_4_ = -(uint)(ABS(auVar86._4_4_) < fVar62);
                auVar39._0_4_ = -(uint)(ABS(auVar86._0_4_) < fVar61);
                auVar39._8_4_ = -(uint)(ABS(auVar86._8_4_) < fVar64);
                auVar39._12_4_ = -(uint)(ABS(auVar86._12_4_) < fVar70);
                auVar76 = blendvps(auVar86,_DAT_01f4bd50,auVar39);
                auVar92._0_4_ = (float)tray.dir.field_0._0_4_ * fVar50 + auVar72._0_4_;
                auVar92._4_4_ = (float)tray.dir.field_0._4_4_ * fVar50 + auVar72._4_4_;
                auVar92._8_4_ = (float)tray.dir.field_0._8_4_ * fVar50 + auVar72._8_4_;
                auVar92._12_4_ = (float)tray.dir.field_0._12_4_ * fVar50 + auVar72._12_4_;
                auVar40._4_4_ = -(uint)(ABS(auVar92._4_4_) < fVar62);
                auVar40._0_4_ = -(uint)(ABS(auVar92._0_4_) < fVar61);
                auVar40._8_4_ = -(uint)(ABS(auVar92._8_4_) < fVar64);
                auVar40._12_4_ = -(uint)(ABS(auVar92._12_4_) < fVar70);
                auVar71 = blendvps(auVar92,_DAT_01f4bd50,auVar40);
                auVar52 = rcpps(auVar72,auVar91);
                fVar70 = auVar52._0_4_;
                auVar96._0_4_ = auVar91._0_4_ * fVar70;
                fVar26 = auVar52._4_4_;
                auVar96._4_4_ = auVar91._4_4_ * fVar26;
                fVar27 = auVar52._8_4_;
                auVar96._8_4_ = auVar91._8_4_ * fVar27;
                fVar44 = auVar52._12_4_;
                auVar96._12_4_ = auVar91._12_4_ * fVar44;
                fVar70 = (1.0 - auVar96._0_4_) * fVar70 + fVar70;
                fVar26 = (1.0 - auVar96._4_4_) * fVar26 + fVar26;
                fVar27 = (1.0 - auVar96._8_4_) * fVar27 + fVar27;
                fVar44 = (1.0 - auVar96._12_4_) * fVar44 + fVar44;
                auVar52 = rcpps(auVar96,auVar76);
                fVar82 = auVar52._0_4_;
                fVar73 = auVar52._4_4_;
                fVar74 = auVar52._8_4_;
                fVar75 = auVar52._12_4_;
                fVar82 = (1.0 - auVar76._0_4_ * fVar82) * fVar82 + fVar82;
                fVar73 = (1.0 - auVar76._4_4_ * fVar73) * fVar73 + fVar73;
                fVar74 = (1.0 - auVar76._8_4_ * fVar74) * fVar74 + fVar74;
                fVar75 = (1.0 - auVar76._12_4_ * fVar75) * fVar75 + fVar75;
                auVar52 = rcpps(auVar52,auVar71);
                fVar83 = auVar52._0_4_;
                fVar87 = auVar52._4_4_;
                fVar88 = auVar52._8_4_;
                fVar89 = auVar52._12_4_;
                fVar61 = *(float *)(uVar20 + 0x40 + (long)pRVar21 * 4);
                fVar83 = (1.0 - auVar71._0_4_ * fVar83) * fVar83 + fVar83;
                fVar87 = (1.0 - auVar71._4_4_ * fVar87) * fVar87 + fVar87;
                fVar88 = (1.0 - auVar71._8_4_ * fVar88) * fVar88 + fVar88;
                fVar89 = (1.0 - auVar71._12_4_ * fVar89) * fVar89 + fVar89;
                fVar62 = *(float *)(uVar20 + 0x50 + (long)pRVar21 * 4);
                fVar64 = *(float *)(uVar20 + 0x60 + (long)pRVar21 * 4);
                fVar45 = (fVar46 * (float)tray.org.field_0._0_4_ +
                         fVar51 * (float)tray.org.field_0._16_4_ +
                         fVar56 * (float)tray.org.field_0._32_4_ + fVar61) * -fVar70;
                fVar78 = (fVar46 * (float)tray.org.field_0._4_4_ +
                         fVar51 * (float)tray.org.field_0._20_4_ +
                         fVar56 * (float)tray.org.field_0._36_4_ + fVar61) * -fVar26;
                fVar81 = (fVar46 * (float)tray.org.field_0._8_4_ +
                         fVar51 * (float)tray.org.field_0._24_4_ +
                         fVar56 * (float)tray.org.field_0._40_4_ + fVar61) * -fVar27;
                fVar61 = (fVar46 * (float)tray.org.field_0._12_4_ +
                         fVar51 * (float)tray.org.field_0._28_4_ +
                         fVar56 * (float)tray.org.field_0._44_4_ + fVar61) * -fVar44;
                fVar46 = (fVar49 * (float)tray.org.field_0._0_4_ +
                         fVar53 * (float)tray.org.field_0._16_4_ +
                         fVar57 * (float)tray.org.field_0._32_4_ + fVar62) * -fVar82;
                fVar51 = (fVar49 * (float)tray.org.field_0._4_4_ +
                         fVar53 * (float)tray.org.field_0._20_4_ +
                         fVar57 * (float)tray.org.field_0._36_4_ + fVar62) * -fVar73;
                fVar56 = (fVar49 * (float)tray.org.field_0._8_4_ +
                         fVar53 * (float)tray.org.field_0._24_4_ +
                         fVar57 * (float)tray.org.field_0._40_4_ + fVar62) * -fVar74;
                fVar49 = (fVar49 * (float)tray.org.field_0._12_4_ +
                         fVar53 * (float)tray.org.field_0._28_4_ +
                         fVar57 * (float)tray.org.field_0._44_4_ + fVar62) * -fVar75;
                fVar53 = (fVar50 * (float)tray.org.field_0._0_4_ +
                         fVar55 * (float)tray.org.field_0._16_4_ +
                         fVar58 * (float)tray.org.field_0._32_4_ + fVar64) * -fVar83;
                fVar57 = (fVar50 * (float)tray.org.field_0._4_4_ +
                         fVar55 * (float)tray.org.field_0._20_4_ +
                         fVar58 * (float)tray.org.field_0._36_4_ + fVar64) * -fVar87;
                fVar62 = (fVar50 * (float)tray.org.field_0._8_4_ +
                         fVar55 * (float)tray.org.field_0._24_4_ +
                         fVar58 * (float)tray.org.field_0._40_4_ + fVar64) * -fVar88;
                fVar50 = (fVar50 * (float)tray.org.field_0._12_4_ +
                         fVar55 * (float)tray.org.field_0._28_4_ +
                         fVar58 * (float)tray.org.field_0._44_4_ + fVar64) * -fVar89;
                fVar70 = fVar70 + fVar45;
                fVar26 = fVar26 + fVar78;
                fVar27 = fVar27 + fVar81;
                fVar44 = fVar44 + fVar61;
                fVar82 = fVar82 + fVar46;
                fVar73 = fVar73 + fVar51;
                fVar74 = fVar74 + fVar56;
                fVar75 = fVar75 + fVar49;
                auVar85._0_4_ = fVar83 + fVar53;
                auVar85._4_4_ = fVar87 + fVar57;
                auVar85._8_4_ = fVar88 + fVar62;
                auVar85._12_4_ = fVar89 + fVar50;
                aVar93 = _DAT_01f45a30;
              }
              uVar14 = (uint)((int)fVar70 < (int)fVar45) * (int)fVar70 |
                       (uint)((int)fVar70 >= (int)fVar45) * (int)fVar45;
              uVar15 = (uint)((int)fVar26 < (int)fVar78) * (int)fVar26 |
                       (uint)((int)fVar26 >= (int)fVar78) * (int)fVar78;
              uVar63 = (uint)((int)fVar27 < (int)fVar81) * (int)fVar27 |
                       (uint)((int)fVar27 >= (int)fVar81) * (int)fVar81;
              uVar65 = (uint)((int)fVar44 < (int)fVar61) * (int)fVar44 |
                       (uint)((int)fVar44 >= (int)fVar61) * (int)fVar61;
              uVar66 = (uint)((int)fVar82 < (int)fVar46) * (int)fVar82 |
                       (uint)((int)fVar82 >= (int)fVar46) * (int)fVar46;
              uVar67 = (uint)((int)fVar73 < (int)fVar51) * (int)fVar73 |
                       (uint)((int)fVar73 >= (int)fVar51) * (int)fVar51;
              uVar68 = (uint)((int)fVar74 < (int)fVar56) * (int)fVar74 |
                       (uint)((int)fVar74 >= (int)fVar56) * (int)fVar56;
              uVar69 = (uint)((int)fVar75 < (int)fVar49) * (int)fVar75 |
                       (uint)((int)fVar75 >= (int)fVar49) * (int)fVar49;
              uVar66 = ((int)uVar66 < (int)uVar14) * uVar14 | ((int)uVar66 >= (int)uVar14) * uVar66;
              uVar67 = ((int)uVar67 < (int)uVar15) * uVar15 | ((int)uVar67 >= (int)uVar15) * uVar67;
              uVar68 = ((int)uVar68 < (int)uVar63) * uVar63 | ((int)uVar68 >= (int)uVar63) * uVar68;
              uVar69 = ((int)uVar69 < (int)uVar65) * uVar65 | ((int)uVar69 >= (int)uVar65) * uVar69;
              iVar25 = auVar85._0_4_;
              uVar14 = (uint)(iVar25 < (int)fVar53) * iVar25 |
                       (uint)(iVar25 >= (int)fVar53) * (int)fVar53;
              iVar3 = auVar85._4_4_;
              uVar15 = (uint)(iVar3 < (int)fVar57) * iVar3 |
                       (uint)(iVar3 >= (int)fVar57) * (int)fVar57;
              iVar4 = auVar85._8_4_;
              uVar63 = (uint)(iVar4 < (int)fVar62) * iVar4 |
                       (uint)(iVar4 >= (int)fVar62) * (int)fVar62;
              iVar5 = auVar85._12_4_;
              uVar65 = (uint)(iVar5 < (int)fVar50) * iVar5 |
                       (uint)(iVar5 >= (int)fVar50) * (int)fVar50;
              auVar60._0_4_ =
                   ((int)uVar14 < (int)uVar66) * uVar66 | ((int)uVar14 >= (int)uVar66) * uVar14;
              auVar60._4_4_ =
                   ((int)uVar15 < (int)uVar67) * uVar67 | ((int)uVar15 >= (int)uVar67) * uVar15;
              auVar60._8_4_ =
                   ((int)uVar63 < (int)uVar68) * uVar68 | ((int)uVar63 >= (int)uVar68) * uVar63;
              auVar60._12_4_ =
                   ((int)uVar65 < (int)uVar69) * uVar69 | ((int)uVar65 >= (int)uVar69) * uVar65;
              uVar66 = (uint)((int)fVar45 < (int)fVar70) * (int)fVar70 |
                       (uint)((int)fVar45 >= (int)fVar70) * (int)fVar45;
              uVar67 = (uint)((int)fVar78 < (int)fVar26) * (int)fVar26 |
                       (uint)((int)fVar78 >= (int)fVar26) * (int)fVar78;
              uVar68 = (uint)((int)fVar81 < (int)fVar27) * (int)fVar27 |
                       (uint)((int)fVar81 >= (int)fVar27) * (int)fVar81;
              uVar69 = (uint)((int)fVar61 < (int)fVar44) * (int)fVar44 |
                       (uint)((int)fVar61 >= (int)fVar44) * (int)fVar61;
              uVar14 = (uint)((int)fVar46 < (int)fVar82) * (int)fVar82 |
                       (uint)((int)fVar46 >= (int)fVar82) * (int)fVar46;
              uVar15 = (uint)((int)fVar51 < (int)fVar73) * (int)fVar73 |
                       (uint)((int)fVar51 >= (int)fVar73) * (int)fVar51;
              uVar63 = (uint)((int)fVar56 < (int)fVar74) * (int)fVar74 |
                       (uint)((int)fVar56 >= (int)fVar74) * (int)fVar56;
              uVar65 = (uint)((int)fVar49 < (int)fVar75) * (int)fVar75 |
                       (uint)((int)fVar49 >= (int)fVar75) * (int)fVar49;
              uVar14 = ((int)uVar66 < (int)uVar14) * uVar66 | ((int)uVar66 >= (int)uVar14) * uVar14;
              uVar15 = ((int)uVar67 < (int)uVar15) * uVar67 | ((int)uVar67 >= (int)uVar15) * uVar15;
              uVar63 = ((int)uVar68 < (int)uVar63) * uVar68 | ((int)uVar68 >= (int)uVar63) * uVar63;
              uVar65 = ((int)uVar69 < (int)uVar65) * uVar69 | ((int)uVar69 >= (int)uVar65) * uVar65;
              uVar66 = (uint)((int)fVar53 < iVar25) * iVar25 |
                       (uint)((int)fVar53 >= iVar25) * (int)fVar53;
              uVar67 = (uint)((int)fVar57 < iVar3) * iVar3 |
                       (uint)((int)fVar57 >= iVar3) * (int)fVar57;
              uVar68 = (uint)((int)fVar62 < iVar4) * iVar4 |
                       (uint)((int)fVar62 >= iVar4) * (int)fVar62;
              uVar69 = (uint)((int)fVar50 < iVar5) * iVar5 |
                       (uint)((int)fVar50 >= iVar5) * (int)fVar50;
              uVar14 = ((int)uVar14 < (int)uVar66) * uVar14 | ((int)uVar14 >= (int)uVar66) * uVar66;
              uVar15 = ((int)uVar15 < (int)uVar67) * uVar15 | ((int)uVar15 >= (int)uVar67) * uVar67;
              uVar63 = ((int)uVar63 < (int)uVar68) * uVar63 | ((int)uVar63 >= (int)uVar68) * uVar68;
              uVar65 = ((int)uVar65 < (int)uVar69) * uVar65 | ((int)uVar65 >= (int)uVar69) * uVar69;
              auVar37._4_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar60._4_4_) * auVar60._4_4_ |
                                  (uint)(tray.tnear.field_0.i[1] >= (int)auVar60._4_4_) *
                                  tray.tnear.field_0.i[1]) <=
                          (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar15) *
                                  tray.tfar.field_0.i[1] |
                                 (tray.tfar.field_0.i[1] >= (int)uVar15) * uVar15));
              auVar37._0_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar60._0_4_) * auVar60._0_4_ |
                                  (uint)(tray.tnear.field_0.i[0] >= (int)auVar60._0_4_) *
                                  tray.tnear.field_0.i[0]) <=
                          (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar14) *
                                  tray.tfar.field_0.i[0] |
                                 (tray.tfar.field_0.i[0] >= (int)uVar14) * uVar14));
              auVar37._8_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar60._8_4_) * auVar60._8_4_ |
                                  (uint)(tray.tnear.field_0.i[2] >= (int)auVar60._8_4_) *
                                  tray.tnear.field_0.i[2]) <=
                          (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar63) *
                                  tray.tfar.field_0.i[2] |
                                 (tray.tfar.field_0.i[2] >= (int)uVar63) * uVar63));
              auVar37._12_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar60._12_4_) * auVar60._12_4_
                                  | (uint)(tray.tnear.field_0.i[3] >= (int)auVar60._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                          (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar65) *
                                  tray.tfar.field_0.i[3] |
                                 (tray.tfar.field_0.i[3] >= (int)uVar65) * uVar65));
              uVar14 = movmskps((int)valid_i,auVar37);
              valid_i = (vint<4> *)(ulong)uVar14;
              sVar12 = sVar22;
              aVar48 = aVar94;
              if ((uVar14 != 0) &&
                 (aVar48.v = (__m128)blendvps(aVar93.v,auVar60,auVar37), sVar12 = sVar1, sVar22 != 8
                 )) {
                pNVar24->ptr = sVar22;
                pNVar24 = pNVar24 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23->v = aVar94;
                paVar23 = paVar23 + 1;
              }
              sVar22 = sVar12;
              aVar94 = aVar48;
            }
            if (sVar22 == 8) goto LAB_006d21d1;
            auVar41._4_4_ = -(uint)(aVar94.v[1] < tray.tfar.field_0.v[1]);
            auVar41._0_4_ = -(uint)(aVar94.v[0] < tray.tfar.field_0.v[0]);
            auVar41._8_4_ = -(uint)(aVar94.v[2] < tray.tfar.field_0.v[2]);
            auVar41._12_4_ = -(uint)(aVar94.v[3] < tray.tfar.field_0.v[3]);
            uVar16 = movmskps((int)uVar20,auVar41);
            uVar14 = POPCOUNT(uVar16);
            root.ptr = sVar22;
          } while ((byte)uVar19 < (byte)uVar14);
          pNVar24->ptr = sVar22;
          pNVar24 = pNVar24 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23->v = aVar94;
          paVar23 = paVar23 + 1;
LAB_006d21d1:
          uVar14 = 4;
        }
        else {
          while (uVar20 != 0) {
            k = (RayQueryContext *)0x0;
            if (uVar20 != 0) {
              for (; (uVar20 >> (long)k & 1) == 0; k = (RayQueryContext *)((long)&k->scene + 1)) {
              }
            }
            uVar20 = uVar20 & uVar20 - 1;
            pRVar21 = k;
            valid_i = (vint<4> *)This;
            bVar13 = occluded1(This,bvh,root,(size_t)k,&pre,ray,&tray,context);
            if (bVar13) {
              terminated.field_0.i[(long)k] = -1;
            }
          }
          uVar63 = movmskps((int)pRVar21,(undefined1  [16])terminated.field_0);
          pRVar21 = (RayQueryContext *)(ulong)uVar63;
          uVar14 = 3;
          if (uVar63 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            uVar14 = 2;
          }
          aVar93 = _DAT_01f45a30;
          if (uVar19 < uVar15) goto LAB_006d1de9;
        }
      } while (uVar14 != 3);
LAB_006d237d:
      auVar43._0_4_ = auVar47._0_4_ & terminated.field_0.i[0];
      auVar43._4_4_ = auVar47._4_4_ & terminated.field_0.i[1];
      auVar43._8_4_ = auVar47._8_4_ & terminated.field_0.i[2];
      auVar43._12_4_ = auVar47._12_4_ & terminated.field_0.i[3];
      auVar52 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar43);
      *(undefined1 (*) [16])(ray + 0x80) = auVar52;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }